

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O2

uint32_t icu_63::Collation::decThreeBytePrimaryByOneStep
                   (uint32_t basePrimary,UBool isCompressible,int32_t step)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = (basePrimary >> 8 & 0xff) - step;
  if (iVar4 < 2) {
    uVar1 = basePrimary >> 0x10 & 0xff;
    uVar2 = isCompressible == '\0' | 0xfe;
    uVar3 = basePrimary - 0x1000000;
    if ((uint)(isCompressible != '\0') * 2 + 3 <= uVar1) {
      uVar2 = uVar1 - 1;
      uVar3 = basePrimary;
    }
    return iVar4 * 0x100 + 0xfe00U | uVar3 & 0xff000000 | uVar2 << 0x10;
  }
  return iVar4 * 0x100 | basePrimary & 0xffff0000;
}

Assistant:

uint32_t
Collation::decThreeBytePrimaryByOneStep(uint32_t basePrimary, UBool isCompressible, int32_t step) {
    // Extract the third byte, minus the minimum byte value,
    // minus the step, modulo the number of usable byte values, plus the minimum.
    U_ASSERT(0 < step && step <= 0x7f);
    int32_t byte3 = ((int32_t)(basePrimary >> 8) & 0xff) - step;
    if(byte3 >= 2) {
        return (basePrimary & 0xffff0000) | ((uint32_t)byte3 << 8);
    }
    byte3 += 254;
    // Same with the second byte,
    // but reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    int32_t byte2 = ((int32_t)(basePrimary >> 16) & 0xff) - 1;
    if(isCompressible) {
        if(byte2 < 4) {
            byte2 = 0xfe;
            basePrimary -= 0x1000000;
        }
    } else {
        if(byte2 < 2) {
            byte2 = 0xff;
            basePrimary -= 0x1000000;
        }
    }
    // First byte, assume no further underflow.
    return (basePrimary & 0xff000000) | ((uint32_t)byte2 << 16) | ((uint32_t)byte3 << 8);
}